

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::SingleEvaluationTest_FailedEXPECT_THROW_MSG_Test>::CreateTest
          (TestFactoryImpl<(anonymous_namespace)::SingleEvaluationTest_FailedEXPECT_THROW_MSG_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x10);
  anon_unknown.dwarf_2992::SingleEvaluationTest_FailedEXPECT_THROW_MSG_Test::
  SingleEvaluationTest_FailedEXPECT_THROW_MSG_Test
            ((SingleEvaluationTest_FailedEXPECT_THROW_MSG_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }